

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

QString * __thiscall
QFileDialogPrivate::getEnvironmentVariable
          (QString *__return_storage_ptr__,QFileDialogPrivate *this,QString *string)

{
  Data *pDVar1;
  char cVar2;
  CutResult CVar3;
  storage_type_conflict *psVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QArrayData *local_40 [3];
  storage_type_conflict *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)(string->d).size < 2) ||
     (cVar2 = QString::startsWith((QChar)(char16_t)string,0x24), cVar2 == '\0')) {
    pDVar1 = (string->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (string->d).ptr;
    (__return_storage_ptr__->d).size = (string->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_40[0] = (QArrayData *)0x1;
    local_28 = (storage_type_conflict *)0xffffffffffffffff;
    CVar3 = QtPrivate::QContainerImplHelper::mid
                      ((string->d).size,(qsizetype *)local_40,(qsizetype *)&local_28);
    psVar4 = local_28;
    if (CVar3 == Null) {
      psVar4 = (storage_type_conflict *)0x0;
    }
    QVar5.m_data = psVar4;
    QVar5.m_size = (qsizetype)local_40;
    QtPrivate::convertToLatin1(QVar5);
    qEnvironmentVariable((char *)__return_storage_ptr__);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialogPrivate::getEnvironmentVariable(const QString &string)
{
#ifdef Q_OS_UNIX
    if (string.size() > 1 && string.startsWith(u'$')) {
        return qEnvironmentVariable(QStringView{string}.mid(1).toLatin1().constData());
    }
#else
    if (string.size() > 2 && string.startsWith(u'%') && string.endsWith(u'%')) {
        return qEnvironmentVariable(QStringView{string}.mid(1, string.size() - 2).toLatin1().constData());
    }
#endif
    return string;
}